

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.h
# Opt level: O2

bool __thiscall Parameter::create(Parameter *this,int argc,char **argv)

{
  char *pcVar1;
  typed_value<int,_char> *ptVar2;
  typed_value<double,_char> *ptVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<bool,_char> *ptVar5;
  size_type sVar6;
  ostream *poVar7;
  variables_map vm;
  options_description desc;
  bool local_1c4;
  bool local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  basic_parsed_options<char> local_1c0;
  undefined8 local_198;
  int local_18c [5];
  double local_178;
  double local_170;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_168;
  undefined1 local_148 [160];
  options_description local_a8 [128];
  
  std::__cxx11::string::string((string *)local_148,"Allowed options",(allocator *)&local_1c0);
  boost::program_options::options_description::options_description
            (local_a8,(string *)local_148,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)local_148);
  local_198 = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_198,"help");
  ptVar2 = boost::program_options::value<int>(&this->k);
  local_18c[4] = 10;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value(ptVar2,local_18c + 4);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)0x13d752,(char *)ptVar2);
  ptVar3 = boost::program_options::value<double>(&this->lambda);
  local_170 = 0.05;
  ptVar3 = boost::program_options::typed_value<double,_char>::default_value(ptVar3,&local_170);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"lambda",(char *)ptVar3);
  ptVar3 = boost::program_options::value<double>(&this->eps);
  local_178 = 0.001;
  ptVar3 = boost::program_options::typed_value<double,_char>::default_value(ptVar3,&local_178);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)0x13d1f9,(char *)ptVar3);
  ptVar2 = boost::program_options::value<int>(&this->max_iter);
  local_18c[3] = 5;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value(ptVar2,local_18c + 3);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"max_iter",(char *)ptVar2);
  ptVar2 = boost::program_options::value<int>(&this->max_inner_iter);
  local_18c[2] = 5;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value(ptVar2,local_18c + 2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"max_inner_iter",(char *)ptVar2);
  ptVar2 = boost::program_options::value<int>(&this->num_of_machine);
  local_18c[1] = 1;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value(ptVar2,local_18c + 1);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"node",(char *)ptVar2);
  ptVar2 = boost::program_options::value<int>(&this->num_of_thread);
  local_18c[0] = 4;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value(ptVar2,local_18c);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"thread",(char *)ptVar2);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&this->meta_path);
  std::__cxx11::string::string((string *)local_148,"../data/netflix/",&local_1c1);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_148);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"data_folder",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&this->output_path);
  std::__cxx11::string::string((string *)&local_1c0,"../output/netflix/",&local_1c2);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_1c0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output_folder",(char *)ptVar4);
  ptVar5 = boost::program_options::value<bool>(&this->output);
  local_1c3 = true;
  ptVar5 = boost::program_options::typed_value<bool,_char>::default_value(ptVar5,&local_1c3);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output",(char *)ptVar5);
  ptVar5 = boost::program_options::value<bool>(&this->verbose);
  local_1c4 = true;
  ptVar5 = boost::program_options::typed_value<bool,_char>::default_value(ptVar5,&local_1c4);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"verbose",(char *)ptVar5);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)local_148);
  boost::program_options::variables_map::variables_map((variables_map *)local_148);
  local_168.super_function_base.vtable = (vtable_base *)0x0;
  local_168.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_168.super_function_base.functor._8_8_ = 0;
  local_168.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>(&local_1c0,argc,argv,local_a8,0,&local_168);
  boost::program_options::store((basic_parsed_options *)&local_1c0,(variables_map *)local_148,false)
  ;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_1c0.options);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_168);
  boost::program_options::notify((variables_map *)local_148);
  std::__cxx11::string::string((string *)&local_1c0,"help",(allocator *)&local_198);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(local_148 + 0x10),(key_type *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (sVar6 != 0) {
    poVar7 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_a8);
    std::operator<<(poVar7,"\n");
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_148);
  boost::program_options::options_description::~options_description(local_a8);
  return sVar6 == 0;
}

Assistant:

bool create(int argc, char **argv) {

        po::options_description desc("Allowed options");
        desc.add_options()
                ("help", "produce help message")
                ("k", po::value<int>(&(Parameter::k))->default_value(10), "dimensionality of latent vector")
                ("lambda", po::value<value_type>(&(Parameter::lambda))->default_value(0.05), "regularization weight")
                ("epsilon", po::value<value_type>(&(Parameter::eps))->default_value(1e-3), "inner termination criterion epsilon")
                ("max_iter", po::value<int>(&(Parameter::max_iter))->default_value(5), "number of iterations")
                ("max_inner_iter", po::value<int>(&(Parameter::max_inner_iter))->default_value(5), "number of inner iterations")
                ("node", po::value<int>(&(Parameter::num_of_machine))->default_value(1), "number of machines")
                ("thread", po::value<int>(&(Parameter::num_of_thread))->default_value(4), "number of thread per machine")
                ("data_folder", po::value<string>(&(Parameter::meta_path))->default_value("../data/netflix/"), "file path of data folder containing meta file")
                ("output_folder", po::value<string>(&(Parameter::output_path))->default_value("../output/netflix/"), "output folder path")
                ("output", po::value<bool>(&(Parameter::output))->default_value(true), "whether output row-wise latent vectors")
                ("verbose", po::value<bool>(&(Parameter::verbose))->default_value(true), "whether output information for debugging");

        po::variables_map vm;
        try {
            po::store(po::parse_command_line(argc, argv, desc), vm);
            po::notify(vm);
        } catch (std::exception &e) {
            cout << endl << e.what() << endl;
            cout << desc << endl;
            return 0;
        }

        if (vm.count("help")) {
            cout << desc << "\n";
            return false;
        } else {
            return true;
        }
    }